

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

void test_read_num_from_non_numeric_mp<double,int(*)(char_const**,double*)>
               (_func_int_char_ptr_ptr_double_ptr *read_f)

{
  int iVar1;
  int iVar2;
  char *__s;
  long lVar3;
  int rc;
  char code;
  char *pos_1;
  double val;
  int i;
  int bad_count;
  char bad_types [16] [16];
  char *pos;
  char *end;
  char str [256];
  int str_cap;
  _func_int_char_ptr_ptr_double_ptr *read_f_local;
  
  str[0xfc] = '\0';
  str[0xfd] = '\x01';
  str[0xfe] = '\0';
  str[0xff] = '\0';
  iVar1 = snprintf((char *)&end,0x100,"ensure failure of reading ");
  __s = str + (long)iVar1 + -8;
  if (read_f == mp_read_double) {
    snprintf(__s,(size_t)(str + (0xf8 - (long)__s)),"double");
  }
  else {
    if (read_f != mp_read_double_lossy) {
      abort();
    }
    snprintf(__s,(size_t)(str + (0xf8 - (long)__s)),"double with precision loss");
  }
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"%s",&end);
  fprintf(_stdout,"\n");
  val._4_4_ = 1;
  mp_encode_array((char *)&i,1);
  lVar3 = (long)val._4_4_;
  val._4_4_ = val._4_4_ + 1;
  mp_encode_map((char *)(&i + lVar3 * 4),1);
  lVar3 = (long)val._4_4_;
  val._4_4_ = val._4_4_ + 1;
  mp_encode_str0((char *)(&i + lVar3 * 4),"abc");
  lVar3 = (long)val._4_4_;
  val._4_4_ = val._4_4_ + 1;
  mp_encode_bool((char *)(&i + lVar3 * 4),true);
  lVar3 = (long)val._4_4_;
  val._4_4_ = val._4_4_ + 1;
  mp_encode_ext((char *)(&i + lVar3 * 4),'\x01',"abc",3);
  lVar3 = (long)val._4_4_;
  val._4_4_ = val._4_4_ + 1;
  mp_encode_bin((char *)(&i + lVar3 * 4),"abc",3);
  lVar3 = (long)val._4_4_;
  val._4_4_ = val._4_4_ + 1;
  mp_encode_nil((char *)(&i + lVar3 * 4));
  for (val._0_4_ = 0; val._0_4_ < val._4_4_; val._0_4_ = val._0_4_ + 1) {
    _rc = &i + (long)val._0_4_ * 4;
    iVar1 = *_rc;
    iVar2 = (*read_f)((char **)&rc,(double *)&pos_1);
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)(char)iVar1);
    _ok((uint)(_rc == &i + (long)val._0_4_ * 4),"pos == bad_types[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76e,"check position for code 0x%02X",(ulong)(uint)(int)(char)iVar1);
  }
  return;
}

Assistant:

static void
test_read_num_from_non_numeric_mp(ReadF read_f)
{
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "ensure failure of reading ");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else if (read_f == (void *)mp_read_double) {
		pos += snprintf(pos, end - pos, "double");
	} else if (read_f == (void *)mp_read_double_lossy) {
		pos += snprintf(pos, end - pos, "double with precision loss");
	} else {
		abort();
	}
	note("%s", str);

	char bad_types[16][16];
	int bad_count = 0;
	mp_encode_array(bad_types[bad_count++], 1);
	mp_encode_map(bad_types[bad_count++], 1);
	mp_encode_str0(bad_types[bad_count++], "abc");
	mp_encode_bool(bad_types[bad_count++], true);
	mp_encode_ext(bad_types[bad_count++], 1, "abc", 3);
	mp_encode_bin(bad_types[bad_count++], "abc", 3);
	mp_encode_nil(bad_types[bad_count++]);
	for (int i = 0; i < bad_count; ++i) {
		TargetT val;
		const char *pos = bad_types[i];
		char code = *pos;
		int rc = read_f(&pos, &val);
		is(rc, -1, "check fail for code 0x%02X", code);
		is(pos, bad_types[i], "check position for code 0x%02X", code);
	}
}